

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O3

bool __thiscall
S2MaxDistanceEdgeTarget::UpdateMinDistance
          (S2MaxDistanceEdgeTarget *this,S2Point *p,S2MaxDistance *min_dist)

{
  bool bVar1;
  S1ChordAngle dist;
  S2MaxDistance local_10;
  
  local_10 = (S2MaxDistance)(min_dist->distance_).length2_;
  bVar1 = S2::UpdateMaxDistance(p,&this->a_,&this->b_,&local_10.distance_);
  if ((bVar1) &&
     ((min_dist->distance_).length2_ <= (double)local_10.distance_.length2_ &&
      (double)local_10.distance_.length2_ != (min_dist->distance_).length2_)) {
    (min_dist->distance_).length2_ = (double)local_10;
  }
  return bVar1;
}

Assistant:

bool S2MaxDistanceEdgeTarget::UpdateMinDistance(
    const S2Point& p, S2MaxDistance* min_dist) {
  S1ChordAngle dist(*min_dist);
  if (S2::UpdateMaxDistance(p, a_, b_, &dist)) {
    min_dist->UpdateMin(S2MaxDistance(dist));
    return true;
  }
  return false;
}